

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

DdNode * cuddUniqueInterIVO(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  int *piVar1;
  DdNode *f;
  DdNode *pDVar2;
  
  f = cuddUniqueInter(unique,index,unique->one,(DdNode *)((ulong)unique->one ^ 1));
  if (f == (DdNode *)0x0) {
    pDVar2 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar2 = cuddBddIteRecur(unique,f,T,E);
    Cudd_RecursiveDeref(unique,f);
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddUniqueInterIVO(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    DdNode *result;
    DdNode *v;

    v = cuddUniqueInter(unique, index, DD_ONE(unique),
                        Cudd_Not(DD_ONE(unique)));
    if (v == NULL)
        return(NULL);
    cuddRef(v);
    result = cuddBddIteRecur(unique, v, T, E);
    Cudd_RecursiveDeref(unique, v);
    return(result);
}